

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void releaseAllSavepoints(Pager *pPager)

{
  sqlite3_file *psVar1;
  sqlite3_io_methods *psVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if (0 < pPager->nSavepoint) {
    lVar3 = 0x10;
    lVar4 = 0;
    do {
      sqlite3BitvecDestroy(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar3 + -0x20));
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (lVar4 < pPager->nSavepoint);
  }
  psVar1 = pPager->sjfd;
  psVar2 = psVar1->pMethods;
  if (pPager->exclusiveMode == '\0') {
    if (psVar2 == (sqlite3_io_methods *)0x0) goto LAB_0012c444;
  }
  else {
    bVar5 = psVar2 != &MemJournalMethods;
    psVar2 = &MemJournalMethods;
    if (bVar5) goto LAB_0012c444;
  }
  (*psVar2->xClose)(psVar1);
  psVar1->pMethods = (sqlite3_io_methods *)0x0;
LAB_0012c444:
  sqlite3_free(pPager->aSavepoint);
  pPager->aSavepoint = (PagerSavepoint *)0x0;
  pPager->nSavepoint = 0;
  pPager->nSubRec = 0;
  return;
}

Assistant:

static void releaseAllSavepoints(Pager *pPager){
  int ii;               /* Iterator for looping through Pager.aSavepoint */
  for(ii=0; ii<pPager->nSavepoint; ii++){
    sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
  }
  if( !pPager->exclusiveMode || sqlite3JournalIsInMemory(pPager->sjfd) ){
    sqlite3OsClose(pPager->sjfd);
  }
  sqlite3_free(pPager->aSavepoint);
  pPager->aSavepoint = 0;
  pPager->nSavepoint = 0;
  pPager->nSubRec = 0;
}